

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O3

void __thiscall
llvm::RangeListEntry::dump
          (RangeListEntry *this,raw_ostream *OS,uint8_t AddrSize,uint8_t MaxEncodingStringLength,
          uint64_t *CurrentBase,DIDumpOptions DumpOpts,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
          LookupPooledAddress)

{
  uint64_t uVar1;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  DIDumpOptions DumpOpts_02;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  uint64_t *puVar5;
  undefined1 auVar6 [16];
  StringRef SVar7;
  StringRef Str;
  StringRef Str_00;
  undefined1 auStack_78 [8];
  Optional<llvm::object::SectionedAddress> SA;
  undefined8 local_38;
  
  if (DumpOpts.Verbose == true) {
    SA.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_4185c2b;
    auStack_78 = (undefined1  [8])&PTR_home_01077fc8;
    SA.Storage.field_0.value.SectionIndex = (this->super_DWARFListEntryBase).Offset;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_78);
    SVar7 = dwarf::RangeListEncodingString((uint)(this->super_DWARFListEntryBase).EntryKind);
    if (SVar7.Length == 0) {
      __assert_fail("!EncodingString.empty() && \"Unknown range entry encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                    ,0xc1,
                    "void llvm::RangeListEntry::dump(raw_ostream &, uint8_t, uint8_t, uint64_t &, DIDumpOptions, llvm::function_ref<Optional<object::SectionedAddress> (uint32_t)>) const"
                   );
    }
    SA.Storage._16_8_ = ((ulong)MaxEncodingStringLength - SVar7.Length) + 1;
    SA.Storage.field_0.value.Address = (uint64_t)anon_var_dwarf_4185c80;
    auStack_78 = (undefined1  [8])&PTR_home_01078670;
    SA.Storage.field_0.value.SectionIndex._0_1_ = 0x5d;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_78);
    if ((this->super_DWARFListEntryBase).EntryKind != '\0') {
      SVar7.Length = 2;
      SVar7.Data = ": ";
      raw_ostream::operator<<(OS,SVar7);
    }
  }
  local_38._6_2_ = DumpOpts._22_2_;
  local_38._0_5_ = DumpOpts._16_5_;
  auVar6 = DumpOpts._0_16_;
  switch((this->super_DWARFListEntryBase).EntryKind) {
  case '\0':
    pcVar4 = "<End of list>";
    if (DumpOpts.Verbose != false) {
      pcVar4 = "";
    }
    sVar3 = 0xd;
    if (DumpOpts.Verbose != false) {
      sVar3 = 0;
    }
    Str.Length = sVar3;
    Str.Data = pcVar4;
    raw_ostream::operator<<(OS,Str);
    goto LAB_00d6cd0d;
  case '\x01':
    (*LookupPooledAddress.callback)
              ((Optional<llvm::object::SectionedAddress> *)auStack_78,LookupPooledAddress.callable,
               (uint)this->Value0);
    puVar5 = &this->Value0;
    if (SA.Storage.field_0.value.SectionIndex._0_1_ != '\0') {
      puVar5 = (uint64_t *)auStack_78;
    }
    *CurrentBase = *puVar5;
    if (DumpOpts.Verbose == false) {
      return;
    }
    SA.Storage.field_0.value.SectionIndex = this->Value0;
    SA.Storage._20_4_ = (uint)AddrSize * 2;
    SA.Storage._16_4_ = (uint)AddrSize * 2;
    goto LAB_00d6ca91;
  default:
    llvm_unreachable_internal
              ("Unsupported range list encoding",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
               ,0xf2);
  case '\x03':
    if (DumpOpts.Verbose != false) {
      auStack_78 = (undefined1  [8])this->Value0;
      SA.Storage.field_0.value.Address = this->Value1;
      SA.Storage.field_0.value.SectionIndex = 0;
      DumpOpts_00.ShowChildren = (bool)(undefined1)local_38;
      DumpOpts_00.ShowParents = (bool)local_38._1_1_;
      DumpOpts_00.ShowForm = (bool)local_38._2_1_;
      DumpOpts_00.SummarizeTypes = (bool)local_38._3_1_;
      DumpOpts_00.Verbose = (bool)local_38._4_1_;
      DumpOpts_00.DisplayRawContents = true;
      DumpOpts_00._22_2_ = local_38._6_2_;
      DumpOpts_00.DumpType = auVar6._0_4_;
      DumpOpts_00.ChildRecurseDepth = auVar6._4_4_;
      DumpOpts_00.ParentRecurseDepth = auVar6._8_4_;
      DumpOpts_00.Version = auVar6._12_2_;
      DumpOpts_00.AddrSize = auVar6[0xe];
      DumpOpts_00.ShowAddresses = (bool)auVar6[0xf];
      DWARFAddressRange::dump((DWARFAddressRange *)auStack_78,OS,(uint)AddrSize,DumpOpts_00);
      sVar2 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
      if (sVar2 < 4) {
        raw_ostream::write(OS,0xdf04d0,(void *)0x4,sVar2);
      }
      else {
        builtin_strncpy(OS->OutBufCur," => ",4);
        OS->OutBufCur = OS->OutBufCur + 4;
      }
    }
    (*LookupPooledAddress.callback)
              ((Optional<llvm::object::SectionedAddress> *)auStack_78,LookupPooledAddress.callable,
               (uint)this->Value0);
    if (SA.Storage.field_0.value.SectionIndex._0_1_ == '\0') {
      auStack_78 = (undefined1  [8])0x0;
    }
    goto LAB_00d6ccd6;
  case '\x04':
    if (DumpOpts.Verbose != false) {
      auStack_78 = (undefined1  [8])this->Value0;
      SA.Storage.field_0.value.Address = this->Value1;
      SA.Storage.field_0.value.SectionIndex = 0;
      DumpOpts_01.ShowChildren = (bool)(undefined1)local_38;
      DumpOpts_01.ShowParents = (bool)local_38._1_1_;
      DumpOpts_01.ShowForm = (bool)local_38._2_1_;
      DumpOpts_01.SummarizeTypes = (bool)local_38._3_1_;
      DumpOpts_01.Verbose = (bool)local_38._4_1_;
      DumpOpts_01.DisplayRawContents = true;
      DumpOpts_01._22_2_ = local_38._6_2_;
      DumpOpts_01.DumpType = auVar6._0_4_;
      DumpOpts_01.ChildRecurseDepth = auVar6._4_4_;
      DumpOpts_01.ParentRecurseDepth = auVar6._8_4_;
      DumpOpts_01.Version = auVar6._12_2_;
      DumpOpts_01.AddrSize = auVar6[0xe];
      DumpOpts_01.ShowAddresses = (bool)auVar6[0xf];
      DWARFAddressRange::dump((DWARFAddressRange *)auStack_78,OS,(uint)AddrSize,DumpOpts_01);
      sVar2 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
      if (sVar2 < 4) {
        raw_ostream::write(OS,0xdf04d0,(void *)0x4,sVar2);
      }
      else {
        builtin_strncpy(OS->OutBufCur," => ",4);
        OS->OutBufCur = OS->OutBufCur + 4;
      }
    }
    uVar1 = *CurrentBase;
    auVar6._8_4_ = (int)uVar1;
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = (int)(uVar1 >> 0x20);
    auStack_78 = (undefined1  [8])(uVar1 + this->Value0);
    SA.Storage.field_0.value.Address = auVar6._8_8_ + this->Value1;
    break;
  case '\x05':
    SA.Storage.field_0.value.SectionIndex = this->Value0;
    *CurrentBase = SA.Storage.field_0.value.SectionIndex;
    if (DumpOpts.Verbose == false) {
      return;
    }
    SA.Storage._20_4_ = (uint)AddrSize * 2;
    SA.Storage._16_4_ = (uint)AddrSize * 2;
LAB_00d6ca91:
    SA.Storage.field_0.value.Address = (long)"0x%*.*lx, 0x%*.*lx" + 9;
    auStack_78 = (undefined1  [8])&PTR_home_010786b0;
    raw_ostream::operator<<(OS,(format_object_base *)auStack_78);
    goto LAB_00d6cd0d;
  case '\x06':
    auStack_78 = (undefined1  [8])this->Value0;
    SA.Storage.field_0.value.Address = this->Value1;
    break;
  case '\a':
    if (DumpOpts.Verbose != false) {
      auStack_78 = (undefined1  [8])this->Value0;
      SA.Storage.field_0.value.Address = this->Value1;
      SA.Storage.field_0.value.SectionIndex = 0;
      DumpOpts_02.ShowChildren = (bool)(undefined1)local_38;
      DumpOpts_02.ShowParents = (bool)local_38._1_1_;
      DumpOpts_02.ShowForm = (bool)local_38._2_1_;
      DumpOpts_02.SummarizeTypes = (bool)local_38._3_1_;
      DumpOpts_02.Verbose = (bool)local_38._4_1_;
      DumpOpts_02.DisplayRawContents = true;
      DumpOpts_02._22_2_ = local_38._6_2_;
      DumpOpts_02.DumpType = auVar6._0_4_;
      DumpOpts_02.ChildRecurseDepth = auVar6._4_4_;
      DumpOpts_02.ParentRecurseDepth = auVar6._8_4_;
      DumpOpts_02.Version = auVar6._12_2_;
      DumpOpts_02.AddrSize = auVar6[0xe];
      DumpOpts_02.ShowAddresses = (bool)auVar6[0xf];
      DWARFAddressRange::dump((DWARFAddressRange *)auStack_78,OS,(uint)AddrSize,DumpOpts_02);
      sVar2 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
      if (sVar2 < 4) {
        raw_ostream::write(OS,0xdf04d0,(void *)0x4,sVar2);
      }
      else {
        builtin_strncpy(OS->OutBufCur," => ",4);
        OS->OutBufCur = OS->OutBufCur + 4;
      }
    }
    auStack_78 = (undefined1  [8])this->Value0;
LAB_00d6ccd6:
    SA.Storage.field_0.value.Address = this->Value1 + (long)auStack_78;
  }
  SA.Storage.field_0.value.SectionIndex = 0;
  DWARFAddressRange::dump((DWARFAddressRange *)auStack_78,OS,(uint)AddrSize,DumpOpts);
LAB_00d6cd0d:
  Str_00.Length = 1;
  Str_00.Data = "\n";
  raw_ostream::operator<<(OS,Str_00);
  return;
}

Assistant:

void RangeListEntry::dump(
    raw_ostream &OS, uint8_t AddrSize, uint8_t MaxEncodingStringLength,
    uint64_t &CurrentBase, DIDumpOptions DumpOpts,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress) const {
  auto PrintRawEntry = [](raw_ostream &OS, const RangeListEntry &Entry,
                          uint8_t AddrSize, DIDumpOptions DumpOpts) {
    if (DumpOpts.Verbose) {
      DumpOpts.DisplayRawContents = true;
      DWARFAddressRange(Entry.Value0, Entry.Value1)
          .dump(OS, AddrSize, DumpOpts);
      OS << " => ";
    }
  };

  if (DumpOpts.Verbose) {
    // Print the section offset in verbose mode.
    OS << format("0x%8.8" PRIx64 ":", Offset);
    auto EncodingString = dwarf::RangeListEncodingString(EntryKind);
    // Unsupported encodings should have been reported during parsing.
    assert(!EncodingString.empty() && "Unknown range entry encoding");
    OS << format(" [%s%*c", EncodingString.data(),
                 MaxEncodingStringLength - EncodingString.size() + 1, ']');
    if (EntryKind != dwarf::DW_RLE_end_of_list)
      OS << ": ";
  }

  switch (EntryKind) {
  case dwarf::DW_RLE_end_of_list:
    OS << (DumpOpts.Verbose ? "" : "<End of list>");
    break;
  case dwarf::DW_RLE_base_addressx: {
    if (auto SA = LookupPooledAddress(Value0))
      CurrentBase = SA->Address;
    else
      CurrentBase = Value0;
    if (!DumpOpts.Verbose)
      return;
    OS << format(" 0x%*.*" PRIx64, AddrSize * 2, AddrSize * 2, Value0);
    break;
  }
  case dwarf::DW_RLE_base_address:
    // In non-verbose mode we do not print anything for this entry.
    CurrentBase = Value0;
    if (!DumpOpts.Verbose)
      return;
    OS << format(" 0x%*.*" PRIx64, AddrSize * 2, AddrSize * 2, Value0);
    break;
  case dwarf::DW_RLE_start_length:
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    DWARFAddressRange(Value0, Value0 + Value1).dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_offset_pair:
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    DWARFAddressRange(Value0 + CurrentBase, Value1 + CurrentBase)
        .dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_start_end:
    DWARFAddressRange(Value0, Value1).dump(OS, AddrSize, DumpOpts);
    break;
  case dwarf::DW_RLE_startx_length: {
    PrintRawEntry(OS, *this, AddrSize, DumpOpts);
    uint64_t Start = 0;
    if (auto SA = LookupPooledAddress(Value0))
      Start = SA->Address;
    DWARFAddressRange(Start, Start + Value1).dump(OS, AddrSize, DumpOpts);
    break;
  }
  default:
    llvm_unreachable("Unsupported range list encoding");
  }
  OS << "\n";
}